

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O0

void leccalc::loadoccurrence<occurrence_granular>
               (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *event_to_periods,occurrence_granular *occ,FILE *fin)

{
  mapped_type *this;
  size_t local_28;
  size_t i;
  FILE *fin_local;
  occurrence_granular *occ_local;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *event_to_periods_local;
  
  local_28 = fread(occ,0x10,1,(FILE *)fin);
  while (local_28 != 0) {
    this = std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](event_to_periods,&occ->event_id);
    std::vector<int,_std::allocator<int>_>::push_back(this,&occ->period_no);
    local_28 = fread(occ,0x10,1,(FILE *)fin);
  }
  return;
}

Assistant:

void loadoccurrence(std::map<int, std::vector<int> >& event_to_periods,
			    T &occ, FILE * fin)
	{

		size_t i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			event_to_periods[occ.event_id].push_back(occ.period_no);
			i = fread(&occ, sizeof(occ), 1, fin);
		}
	}